

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution1d.cpp
# Opt level: O0

int __thiscall ncnn::Deconvolution1D::load_param(Deconvolution1D *this,ParamDict *pd)

{
  int *piVar1;
  int iVar2;
  Mat *pMVar3;
  ParamDict *in_RSI;
  long in_RDI;
  Mat local_160;
  Mat local_118;
  ParamDict *local_d0;
  Mat *local_c0;
  Mat *local_b8;
  Mat *local_a8;
  int local_98;
  undefined4 local_94;
  Mat *local_90;
  Mat *local_88;
  Mat *local_80;
  int local_78;
  undefined4 local_74;
  Mat *local_70;
  int local_58;
  undefined4 local_54;
  Mat *local_50;
  int local_38;
  undefined4 local_34;
  Mat *local_30;
  void *local_18;
  void *local_8;
  
  local_d0 = in_RSI;
  iVar2 = ParamDict::get(in_RSI,0,0);
  *(int *)(in_RDI + 0xd0) = iVar2;
  iVar2 = ParamDict::get(local_d0,1,0);
  *(int *)(in_RDI + 0xd4) = iVar2;
  iVar2 = ParamDict::get(local_d0,2,1);
  *(int *)(in_RDI + 0xd8) = iVar2;
  iVar2 = ParamDict::get(local_d0,3,1);
  *(int *)(in_RDI + 0xdc) = iVar2;
  iVar2 = ParamDict::get(local_d0,4,0);
  *(int *)(in_RDI + 0xe0) = iVar2;
  iVar2 = ParamDict::get(local_d0,0xf,*(int *)(in_RDI + 0xe0));
  *(int *)(in_RDI + 0xe4) = iVar2;
  iVar2 = ParamDict::get(local_d0,0x12,0);
  *(int *)(in_RDI + 0xe8) = iVar2;
  iVar2 = ParamDict::get(local_d0,0x14,0);
  *(int *)(in_RDI + 0xec) = iVar2;
  iVar2 = ParamDict::get(local_d0,5,0);
  *(int *)(in_RDI + 0xf0) = iVar2;
  iVar2 = ParamDict::get(local_d0,6,0);
  *(int *)(in_RDI + 0xf4) = iVar2;
  iVar2 = ParamDict::get(local_d0,9,0);
  *(int *)(in_RDI + 0xf8) = iVar2;
  local_c0 = &local_160;
  local_160.data = (void *)0x0;
  local_160.refcount = (int *)0x0;
  local_160.elemsize = 0;
  local_160.elempack = 0;
  local_160.allocator = (Allocator *)0x0;
  local_160.dims = 0;
  local_160.w = 0;
  local_160.h = 0;
  local_160.d = 0;
  local_160.c = 0;
  local_160.cstep = 0;
  ParamDict::get(&local_118,local_d0,10,local_c0);
  pMVar3 = (Mat *)(in_RDI + 0x100);
  local_90 = &local_118;
  local_88 = pMVar3;
  if (pMVar3 != local_90) {
    if (local_118.refcount != (int *)0x0) {
      local_94 = 1;
      LOCK();
      local_98 = *local_118.refcount;
      *local_118.refcount = *local_118.refcount + 1;
      UNLOCK();
    }
    local_70 = pMVar3;
    if (*(long *)(in_RDI + 0x108) != 0) {
      piVar1 = *(int **)(in_RDI + 0x108);
      local_74 = 0xffffffff;
      LOCK();
      local_78 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (local_78 == 1) {
        if (*(long *)(in_RDI + 0x120) == 0) {
          local_8 = pMVar3->data;
          if (local_8 != (void *)0x0) {
            free(local_8);
          }
        }
        else {
          (**(code **)(**(long **)(in_RDI + 0x120) + 0x18))(*(long **)(in_RDI + 0x120),pMVar3->data)
          ;
        }
      }
    }
    pMVar3->data = (void *)0x0;
    *(undefined8 *)(in_RDI + 0x110) = 0;
    *(undefined4 *)(in_RDI + 0x118) = 0;
    *(undefined4 *)(in_RDI + 0x128) = 0;
    *(undefined4 *)(in_RDI + 300) = 0;
    *(undefined4 *)(in_RDI + 0x130) = 0;
    *(undefined4 *)(in_RDI + 0x134) = 0;
    *(undefined4 *)(in_RDI + 0x138) = 0;
    *(undefined8 *)(in_RDI + 0x140) = 0;
    *(undefined8 *)(in_RDI + 0x108) = 0;
    pMVar3->data = local_90->data;
    *(int **)(in_RDI + 0x108) = local_90->refcount;
    *(size_t *)(in_RDI + 0x110) = local_90->elemsize;
    *(int *)(in_RDI + 0x118) = local_90->elempack;
    *(Allocator **)(in_RDI + 0x120) = local_90->allocator;
    *(int *)(in_RDI + 0x128) = local_90->dims;
    *(int *)(in_RDI + 300) = local_90->w;
    *(int *)(in_RDI + 0x130) = local_90->h;
    *(int *)(in_RDI + 0x134) = local_90->d;
    *(int *)(in_RDI + 0x138) = local_90->c;
    *(size_t *)(in_RDI + 0x140) = local_90->cstep;
  }
  local_b8 = &local_118;
  local_80 = pMVar3;
  local_30 = local_b8;
  if (local_118.refcount != (int *)0x0) {
    local_34 = 0xffffffff;
    LOCK();
    local_38 = *local_118.refcount;
    *local_118.refcount = *local_118.refcount + -1;
    UNLOCK();
    if (local_38 == 1) {
      if (local_118.allocator == (Allocator *)0x0) {
        if (local_118.data != (void *)0x0) {
          free(local_118.data);
        }
      }
      else {
        (*(local_118.allocator)->_vptr_Allocator[3])(local_118.allocator,local_118.data);
      }
    }
  }
  local_118.data = (void *)0x0;
  local_118.elemsize = 0;
  local_118.elempack = 0;
  local_118.dims = 0;
  local_118.w = 0;
  local_118.h = 0;
  local_118.d = 0;
  local_118.c = 0;
  local_118.cstep = 0;
  local_118.refcount = (int *)0x0;
  local_a8 = &local_160;
  if (local_160.refcount != (int *)0x0) {
    local_54 = 0xffffffff;
    LOCK();
    local_58 = *local_160.refcount;
    *local_160.refcount = *local_160.refcount + -1;
    UNLOCK();
    if (local_58 == 1) {
      local_50 = local_a8;
      if (local_160.allocator == (Allocator *)0x0) {
        local_18 = local_160.data;
        if (local_160.data != (void *)0x0) {
          free(local_160.data);
        }
      }
      else {
        (*(local_160.allocator)->_vptr_Allocator[3])(local_160.allocator,local_160.data);
      }
    }
  }
  return 0;
}

Assistant:

int Deconvolution1D::load_param(const ParamDict& pd)
{
    num_output = pd.get(0, 0);
    kernel_w = pd.get(1, 0);
    dilation_w = pd.get(2, 1);
    stride_w = pd.get(3, 1);
    pad_left = pd.get(4, 0);
    pad_right = pd.get(15, pad_left);
    output_pad_right = pd.get(18, 0);
    output_w = pd.get(20, 0);
    bias_term = pd.get(5, 0);
    weight_data_size = pd.get(6, 0);
    activation_type = pd.get(9, 0);
    activation_params = pd.get(10, Mat());

    return 0;
}